

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

DecodeStatus DecodeLDRPreImm(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  void *Decoder_00;
  uint64_t Address_00;
  uint64_t Address_01;
  uint uVar3;
  
  uVar3 = Insn >> 0x10 & 0xf;
  uVar1 = Insn >> 0xc & 0xf;
  Decoder_00 = (void *)(ulong)((uint)(uVar3 != uVar1) * 2 + 1);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar1]);
  MCOperand_CreateReg0(Inst,(uint)GPRDecoderTable[uVar3]);
  DVar2 = DecodeAddrModeImm12Operand
                    (Inst,Insn >> 0xb & 0x1000 | uVar3 << 0xd | Insn & 0xfff,Address_00,Decoder_00);
  if ((DVar2 != MCDisassembler_Success) && (DVar2 != MCDisassembler_SoftFail)) {
    return MCDisassembler_Fail;
  }
  DVar2 = DecodePredicateOperand(Inst,Insn >> 0x1c,Address_01,(void *)(ulong)DVar2);
  DVar2 = (*(code *)(&DAT_001cdf0c + *(int *)(&DAT_001cdf0c + (ulong)DVar2 * 4)))();
  return DVar2;
}

Assistant:

static DecodeStatus DecodeLDRPreImm(MCInst *Inst, unsigned Insn,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	unsigned pred;
	unsigned Rn = fieldFromInstruction_4(Insn, 16, 4);
	unsigned Rt = fieldFromInstruction_4(Insn, 12, 4);
	unsigned imm = fieldFromInstruction_4(Insn, 0, 12);
	imm |= fieldFromInstruction_4(Insn, 16, 4) << 13;
	imm |= fieldFromInstruction_4(Insn, 23, 1) << 12;
	pred = fieldFromInstruction_4(Insn, 28, 4);

	if (Rn == 0xF || Rn == Rt) S = MCDisassembler_SoftFail;

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rt, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodeAddrModeImm12Operand(Inst, imm, Address, Decoder)))
		return MCDisassembler_Fail;
	if (!Check(&S, DecodePredicateOperand(Inst, pred, Address, Decoder)))
		return MCDisassembler_Fail;

	return S;
}